

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

string * __thiscall
cppcms::rpc::json_call::method_abi_cxx11_(string *__return_storage_ptr__,json_call *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->method_);
  return __return_storage_ptr__;
}

Assistant:

std::string json_call::method()
	{
		return method_;
	}